

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

bool __thiscall trieste::detail::Opt::match(Opt *this,NodeIt *it,Node *parent,Match *match)

{
  size_t sVar1;
  shared_ptr<trieste::NodeDef> *psVar2;
  pointer ppVar3;
  element_type *peVar4;
  int iVar5;
  size_t sVar6;
  
  psVar2 = it->_M_current;
  sVar6 = match->index;
  ppVar3 = (match->captures).
           super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar1 = sVar6 + 1;
  match->index = sVar1;
  if (((long)(match->captures).
             super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3) * 0x6db6db6db6db6db7 -
      sVar1 == 0) {
    std::
    vector<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
    ::resize((vector<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
              *)&match->captures,sVar1 * 2);
    sVar6 = match->index - 1;
  }
  else {
    ppVar3[sVar1].first = false;
  }
  peVar4 = (this->pattern).
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (*peVar4->_vptr_PatternDef[4])(peVar4,it,parent,match);
  if ((char)iVar5 == '\0') {
    it->_M_current = psVar2;
    match->index = sVar6;
  }
  peVar4 = (this->super_PatternDef).continuation.
           super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    iVar5 = (*peVar4->_vptr_PatternDef[4])(peVar4,it,parent,match);
    return SUB41(iVar5,0);
  }
  return true;
}

Assistant:

bool match(NodeIt& it, const Node& parent, Match& match) const& override
      {
        auto backtrack_it = it;
        auto backtrack_frame = match.add_frame();
        if (!pattern->match(it, parent, match))
        {
          it = backtrack_it;
          match.return_to_frame(backtrack_frame);
        }
        return match_continuation(it, parent, match);
      }